

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

ssize_t __thiscall Fl_Preferences::RootNode::write(RootNode *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  FILE *__s;
  FILE *__n_00;
  void *__buf_00;
  ssize_t sVar2;
  char *pcVar3;
  
  sVar2 = 0xffffffff;
  if (this->filename_ != (char *)0x0) {
    fl_make_path_for_file(this->filename_);
    __s = (FILE *)fl_fopen(this->filename_,"wb");
    if (__s != (FILE *)0x0) {
      __n_00 = __s;
      fwrite("; FLTK preferences file format 1.0\n",0x23,1,__s);
      sVar2 = 0;
      fprintf(__s,"; vendor: %s\n",this->vendor_);
      fprintf(__s,"; application: %s\n",this->application_);
      Node::write(this->prefs_->node,(int)__s,__buf_00,(size_t)__n_00);
      fclose(__s);
      pcVar3 = this->filename_;
      iVar1 = strncmp(pcVar3,"/etc/fltk/",10);
      if (iVar1 == 0) {
        pcVar3 = pcVar3 + 9;
        do {
          *pcVar3 = '\0';
          fl_chmod(this->filename_,0x1ed);
          *pcVar3 = '/';
          pcVar3 = strchr(pcVar3 + 1,0x2f);
        } while (pcVar3 != (char *)0x0);
        fl_chmod(this->filename_,0x1a4);
      }
    }
  }
  return sVar2;
}

Assistant:

int Fl_Preferences::RootNode::write() {
  if (!filename_)   // RUNTIME preferences
    return -1; 
  fl_make_path_for_file(filename_);
  FILE *f = fl_fopen( filename_, "wb" );
  if ( !f )
    return -1; 
  fprintf( f, "; FLTK preferences file format 1.0\n" );
  fprintf( f, "; vendor: %s\n", vendor_ );
  fprintf( f, "; application: %s\n", application_ );
  prefs_->node->write( f );
  fclose( f );
#if !(defined(__APPLE__) || defined(WIN32))
  // unix: make sure that system prefs are user-readable
  if (strncmp(filename_, "/etc/fltk/", 10) == 0) {
    char *p;
    p = filename_ + 9;
    do {			 // for each directory to the pref file
      *p = 0;
      fl_chmod(filename_, 0755); // rwxr-xr-x
      *p = '/';
      p = strchr(p+1, '/');
    } while (p);
    fl_chmod(filename_, 0644);   // rw-r--r--
  }
#endif
  return 0;
}